

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void OptimizeModule(CompilerContext *ctx)

{
  ExpressionContext *ctx_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  VmFunction *function;
  VmModule *pVVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  IntrusiveList<VmFunction> *pIVar18;
  TraceScope traceScope;
  TraceScope traceScope_2;
  
  ctx_00 = &ctx->exprCtx;
  uVar15 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar15;
  (ctx->statistics).finishTime = 0;
  pIVar18 = &ctx->vmModule->functions;
  do {
    function = pIVar18->head;
    if (function == (VmFunction *)0x0) {
      uVar15 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"IrOptimization",uVar15);
      return;
    }
    if (function->firstBlock != (VmBlock *)0x0) {
      iVar17 = ctx->optimizationLevel;
      if (iVar17 == 0) {
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        iVar17 = ctx->optimizationLevel;
      }
      if (0 < iVar17) {
        if ((OptimizeModule(CompilerContext&)::token == '\0') &&
           (iVar17 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar17 != 0)) {
          OptimizeModule::token = NULLC::TraceGetToken("compiler","OptimizationLevel1");
          __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope(&traceScope,OptimizeModule::token);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_PEEPHOLE);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONSTANT_PROPAGATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_ARRAY_TO_ELEMENTS);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        NULLC::TraceScope::~TraceScope(&traceScope);
      }
      RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_LEGALIZE_ARRAY_VALUES);
      if (1 < ctx->optimizationLevel) {
        if ((OptimizeModule(CompilerContext&)::token == '\0') &&
           (iVar17 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar17 != 0)) {
          OptimizeModule(CompilerContext&)::token =
               NULLC::TraceGetToken("compiler","OptimizationLevel2");
          __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope(&traceScope,OptimizeModule(CompilerContext&)::token);
        iVar17 = 7;
        do {
          iVar17 = iVar17 + -1;
          if (iVar17 == 0) break;
          if ((OptimizeModule(CompilerContext&)::token == '\0') &&
             (iVar16 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar16 != 0))
          {
            OptimizeModule(CompilerContext&)::token = NULLC::TraceGetToken("compiler","iteration");
            __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
          }
          NULLC::TraceScope::TraceScope(&traceScope_2,OptimizeModule(CompilerContext&)::token);
          pVVar10 = ctx->vmModule;
          uVar15 = pVVar10->constantPropagations;
          uVar1 = pVVar10->peepholeOptimizations;
          uVar2 = pVVar10->deadCodeEliminations;
          uVar3 = pVVar10->controlFlowSimplifications;
          uVar4 = pVVar10->loadStorePropagations;
          uVar5 = pVVar10->commonSubexprEliminations;
          uVar6 = pVVar10->deadAllocaStoreEliminations;
          RunVmPass(ctx_00,pVVar10,function,VM_PASS_OPT_CONSTANT_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_PEEPHOLE);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
          pVVar10 = ctx->vmModule;
          uVar11 = pVVar10->peepholeOptimizations;
          uVar12 = pVVar10->constantPropagations;
          uVar13 = pVVar10->deadCodeEliminations;
          uVar14 = pVVar10->controlFlowSimplifications;
          uVar7 = pVVar10->loadStorePropagations;
          uVar8 = pVVar10->commonSubexprEliminations;
          uVar9 = pVVar10->deadAllocaStoreEliminations;
          NULLC::TraceScope::~TraceScope(&traceScope_2);
        } while (uVar15 + uVar1 + uVar2 + uVar3 + uVar4 + uVar5 + uVar6 !=
                 uVar8 + uVar9 + uVar14 + uVar12 + uVar13 + uVar11 + uVar7);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_MEMORY_TO_REGISTER);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LATE_PEEPHOLE);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
        NULLC::TraceScope::~TraceScope(&traceScope);
      }
    }
    pIVar18 = (IntrusiveList<VmFunction> *)&function->next;
  } while( true );
}

Assistant:

void OptimizeModule(CompilerContext &ctx)
{
	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	for(VmFunction *function = ctx.vmModule->functions.head; function; function = function->next)
	{
		if(!function->firstBlock)
			continue;

		// Dead code elimination is required for correct register allocation
		if(ctx.optimizationLevel == 0)
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

		if(ctx.optimizationLevel >= 1)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel1");

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_ARRAY_TO_ELEMENTS);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
		}

		RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_LEGALIZE_ARRAY_VALUES);

		if(ctx.optimizationLevel >= 2)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel2");

			for(unsigned i = 0; i < 6; i++)
			{
				TRACE_SCOPE("compiler", "iteration");

				unsigned before = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);

				unsigned after = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				// Reached fixed point
				if(before == after)
					break;
			}

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_MEMORY_TO_REGISTER);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LATE_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
		}
	}

	ctx.statistics.Finish("IrOptimization", NULLCTime::clockMicro());
}